

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_mask_table_alloc(PS_Mask_Table table,FT_Memory memory,PS_Mask *amask)

{
  PS_Mask pPVar1;
  uint count_00;
  PS_Mask local_30;
  PS_Mask mask;
  FT_Error error;
  FT_UInt count;
  PS_Mask *amask_local;
  FT_Memory memory_local;
  PS_Mask_Table table_local;
  
  mask._0_4_ = 0;
  local_30 = (PS_Mask)0x0;
  count_00 = table->num_masks + 1;
  if ((count_00 <= table->max_masks) ||
     (mask._0_4_ = ps_mask_table_ensure(table,count_00,memory), (FT_Error)mask == 0)) {
    pPVar1 = table->masks;
    local_30 = pPVar1 + ((ulong)count_00 - 1);
    local_30->num_bits = 0;
    pPVar1[(ulong)count_00 - 1].end_point = 0;
    if (pPVar1[(ulong)count_00 - 1].max_bits != 0) {
      memset(pPVar1[(ulong)count_00 - 1].bytes,0,(ulong)(pPVar1[(ulong)count_00 - 1].max_bits >> 3))
      ;
    }
    table->num_masks = count_00;
  }
  *amask = local_30;
  return (FT_Error)mask;
}

Assistant:

static FT_Error
  ps_mask_table_alloc( PS_Mask_Table  table,
                       FT_Memory      memory,
                       PS_Mask       *amask )
  {
    FT_UInt   count;
    FT_Error  error = FT_Err_Ok;
    PS_Mask   mask  = NULL;


    count = table->num_masks;
    count++;

    if ( count > table->max_masks )
    {
      error = ps_mask_table_ensure( table, count, memory );
      if ( error )
        goto Exit;
    }

    mask             = table->masks + count - 1;
    mask->num_bits   = 0;
    mask->end_point  = 0;
    /* reused mask must be cleared */
    if ( mask->max_bits )
      FT_MEM_ZERO( mask->bytes, mask->max_bits >> 3 );

    table->num_masks = count;

  Exit:
    *amask = mask;
    return error;
  }